

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

string * __thiscall testing::internal::MatchMatrix::DebugString_abi_cxx11_(MatchMatrix *this)

{
  size_t sVar1;
  MatchMatrix *this_00;
  MatchMatrix *in_RSI;
  string *in_RDI;
  size_t j;
  size_t i;
  char *sep;
  stringstream ss;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  MatchMatrix *ilhs;
  MatchMatrix *local_1c0;
  ulong local_1a8;
  char *local_1a0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0 = "";
  local_1a8 = 0;
  while( true ) {
    sVar1 = LhsSize(in_RSI);
    if (sVar1 <= local_1a8) break;
    std::operator<<(local_188,local_1a0);
    local_1c0 = (MatchMatrix *)0x0;
    while( true ) {
      ilhs = local_1c0;
      this_00 = (MatchMatrix *)RhsSize(in_RSI);
      if (this_00 <= ilhs) break;
      in_stack_fffffffffffffe07 =
           HasEdge(this_00,(size_t)ilhs,
                   CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
      std::ostream::operator<<(local_188,(bool)in_stack_fffffffffffffe07);
      local_1c0 = local_1c0 + 1;
    }
    local_1a0 = ";";
    local_1a8 = local_1a8 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string MatchMatrix::DebugString() const {
  ::std::stringstream ss;
  const char *sep = "";
  for (size_t i = 0; i < LhsSize(); ++i) {
    ss << sep;
    for (size_t j = 0; j < RhsSize(); ++j) {
      ss << HasEdge(i, j);
    }
    sep = ";";
  }
  return ss.str();
}